

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

char * blogc_get_filename(char *f)

{
  char cVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  
  if ((f == (char *)0x0) || (*f == '\0')) {
    return (char *)0x0;
  }
  __s = bc_strdup(f);
  sVar3 = strlen(__s);
  pcVar7 = __s;
  if (-1 < (int)(uint)sVar3) {
    uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
    pcVar9 = __s + uVar4 + 1;
    bVar8 = false;
    lVar5 = uVar4 + 1;
    do {
      cVar1 = pcVar9[-1];
      if ((bVar8) || (cVar1 != '.')) {
        pcVar7 = pcVar9;
        if ((cVar1 == '\\') || (cVar1 == '/')) break;
      }
      else {
        pcVar9[-1] = '\0';
        bVar8 = true;
      }
      pcVar9 = pcVar9 + -1;
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
      pcVar7 = __s;
    } while (lVar6 != 0 && bVar2);
  }
  pcVar7 = bc_strdup(pcVar7);
  free(__s);
  return pcVar7;
}

Assistant:

char*
blogc_get_filename(const char *f)
{
    if (f == NULL)
        return NULL;

    if (strlen(f) == 0)
        return NULL;

    char *filename = bc_strdup(f);

    // keep a pointer to original string
    char *tmp = filename;

    bool removed_dot = false;
    for (int i = strlen(tmp); i >= 0 ; i--) {

        // remove last extension
        if (!removed_dot && tmp[i] == '.') {
            tmp[i] = '\0';
            removed_dot = true;
            continue;
        }

        if (tmp[i] == '/' || tmp[i] == '\\') {
            tmp += i + 1;
            break;
        }
    }

    char *final_filename = bc_strdup(tmp);
    free(filename);

    return final_filename;
}